

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O2

void __thiscall QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded(QTlsBackendOpenSSL *this)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  QByteArray *ba;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QDirListing dirList;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QByteArray> local_78;
  QMutexLocker<QRecursiveMutex> local_60;
  QArrayDataPointer<QSslCertificate> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ensureCiphersAndCertsLoaded()::initMutex == '\0') {
    iVar2 = __cxa_guard_acquire(&ensureCiphersAndCertsLoaded()::initMutex);
    if (iVar2 != 0) {
      __cxa_atexit(QRecursiveMutex::~QRecursiveMutex,&ensureCiphersAndCertsLoaded::initMutex,
                   &__dso_handle);
      __cxa_guard_release(&ensureCiphersAndCertsLoaded()::initMutex);
    }
  }
  if ((QBasicAtomicInteger<int>)
      ensureCiphersAndCertsLoaded::initialized.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i ==
      (QBasicAtomicInteger<int>)0x0) {
    local_60.m_isLocked = true;
    local_60._9_7_ = 0xaaaaaaaaaaaaaa;
    local_60.m_mutex = &ensureCiphersAndCertsLoaded::initMutex;
    QRecursiveMutex::lock(&ensureCiphersAndCertsLoaded::initMutex);
    local_60.m_isLocked = true;
    if ((ensureCiphersAndCertsLoaded()::initializationStarted == '\0') &&
       ((QBasicAtomicInteger<int>)
        ensureCiphersAndCertsLoaded::initialized.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i ==
        (QBasicAtomicInteger<int>)0x0)) {
      ensureCiphersAndCertsLoaded()::initializationStarted = '\x01';
      resetDefaultCiphers();
      QTlsBackend::resetDefaultEllipticCurves();
      local_78.size = -0x5555555555555556;
      local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_78.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      QSslSocketPrivate::unixRootCertDirectories();
      local_98.size = -0x5555555555555556;
      local_98.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_98.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____s
                ((QString *)&local_50,
                 L"[0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f].[0-9]",0x46);
      args._M_len = 1;
      args._M_array = (iterator)&local_50;
      QList<QString>::QList((QList<QString> *)&local_98,args);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
      ba = local_78.ptr;
      for (lVar4 = local_78.size * 0x18; lVar4 != 0; lVar4 = lVar4 + -0x18) {
        _dirList = 0xaaaaaaaaaaaaaaaa;
        QString::fromLatin1<void>((QString *)&local_50,ba);
        QDirListing::QDirListing(&dirList,&local_50,&local_98,0x18);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
        lVar3 = QDirListing::begin();
        if (lVar3 != 0) {
          QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
          QDirListing::~QDirListing(&dirList);
          break;
        }
        QDirListing::~QDirListing(&dirList);
        ba = ba + 1;
      }
      cVar1 = QSslSocketPrivate::rootCertOnDemandLoadingSupported();
      if (cVar1 == '\0') {
        QTlsPrivate::systemCaCertificates();
        QTlsBackend::setDefaultCaCertificates((QList *)&local_50);
        QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_50);
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_78);
      ensureCiphersAndCertsLoaded::initialized.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (QAtomicInteger<int>)(QBasicAtomicInteger<int>)0x1;
    }
    QMutexLocker<QRecursiveMutex>::~QMutexLocker(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTlsBackendOpenSSL::ensureCiphersAndCertsLoaded() const
{
    Q_CONSTINIT static bool initializationStarted = false;
    Q_CONSTINIT static QAtomicInt initialized = Q_BASIC_ATOMIC_INITIALIZER(0);
    Q_CONSTINIT static QRecursiveMutex initMutex;

    if (initialized.loadAcquire())
        return;

    const QMutexLocker locker(&initMutex);

    if (initializationStarted || initialized.loadAcquire())
        return;

    // Indicate that the initialization has already started in the current
    // thread in case of recursive calls. The atomic variable cannot be used
    // for this because it is checked without holding the init mutex.
    initializationStarted = true;

    auto guard = qScopeGuard([] { initialized.storeRelease(1); });

    resetDefaultCiphers();
    resetDefaultEllipticCurves();

#if QT_CONFIG(library)
    //load symbols needed to receive certificates from system store
#if defined(Q_OS_QNX)
    QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
#elif defined(Q_OS_UNIX) && !defined(Q_OS_DARWIN)
    // check whether we can enable on-demand root-cert loading (i.e. check whether the sym links are there)
    const QList<QByteArray> dirs = QSslSocketPrivate::unixRootCertDirectories();
    const QStringList symLinkFilter{
        u"[0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f][0-9a-f].[0-9]"_s};
    for (const auto &dir : dirs) {
        QDirListing dirList(QString::fromLatin1(dir), symLinkFilter,
                            QDirListing::IteratorFlag::FilesOnly);
        if (dirList.cbegin() != dirList.cend()) { // Not empty
            QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
            break;
        }
    }
#endif
#endif // QT_CONFIG(library)
    // if on-demand loading was not enabled, load the certs now
    if (!QSslSocketPrivate::rootCertOnDemandLoadingSupported())
        setDefaultCaCertificates(systemCaCertificates());
#ifdef Q_OS_WIN
    //Enabled for fetching additional root certs from windows update on windows.
    //This flag is set false by setDefaultCaCertificates() indicating the app uses
    //its own cert bundle rather than the system one.
    //Same logic that disables the unix on demand cert loading.
    //Unlike unix, we do preload the certificates from the cert store.
    QSslSocketPrivate::setRootCertOnDemandLoadingSupported(true);
#endif
}